

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_digest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  uint uVar5;
  string err;
  anon_class_16_2_6a24d160 process_motif;
  args_t args;
  char complement_chars [255];
  
  argparse::args_t::args_t(&args,argc,argv);
  initAlphabets(false,(char *)0x0,true);
  for (lVar3 = 0; lVar3 != 0x400; lVar3 = lVar3 + 4) {
    *(undefined4 *)((long)allowed_chars + lVar3) = 0xffffffff;
  }
  allowed_chars[0x41] = 0;
  allowed_chars[0x43] = 1;
  allowed_chars[0x47] = 2;
  allowed_chars[0x54] = 3;
  memset(&complement_chars,0,0xff);
  complement_chars[0x41] = 'T';
  complement_chars[0x54] = 'A';
  complement_chars[0x43] = 'G';
  complement_chars[0x47] = 'C';
  process_motif.args = &args;
  process_motif.complement_chars = &complement_chars;
  StringBuffer::StringBuffer((StringBuffer *)&err);
  sVar4 = strlen(args.motif_list);
  bVar1 = false;
  for (uVar5 = 0; (long)(ulong)uVar5 < (long)sVar4; uVar5 = uVar5 + 1) {
    iVar2 = toupper((int)args.motif_list[uVar5]);
    if (allowed_chars[(char)iVar2] < 0) {
      if (bVar1) {
        main::anon_class_16_2_6a24d160::operator()(&process_motif,(StringBuffer *)&err);
      }
      bVar1 = false;
    }
    else {
      bVar1 = true;
      StringBuffer::appendChar((StringBuffer *)&err,(char)iVar2);
    }
  }
  if (bVar1) {
    main::anon_class_16_2_6a24d160::operator()(&process_motif,(StringBuffer *)&err);
  }
  StringBuffer::~StringBuffer((StringBuffer *)&err);
  argparse::args_t::~args_t(&args);
  return 1;
}

Assistant:

int main(int argc, const char *argv[]) {
    args_t args = args_t(argc, argv);
    
    initAlphabets(false, NULL, true);
    
    
    for (int i = 0; i < 256; i++) {
        allowed_chars[i] = -1;
    }
    
    allowed_chars['A'] = 0;
    allowed_chars['C'] = 1;
    allowed_chars['G'] = 2;
    allowed_chars['T'] = 3;
    
    char complement_chars[255] = {0};
    complement_chars['A'] = 'T';
    complement_chars['T'] = 'A';
    complement_chars['C'] = 'G';
    complement_chars['G'] = 'C';


    auto process_motif = [&] (StringBuffer& pattern) -> void {
        int L = pattern.length();
        if (L >= 4 && L <= 16) {
            cout << pattern.getString () << endl;
            if (!patterns[L]) {
                patterns[L] = new Vector;
            }
            patterns[L]->appendValue(patternToCode (pattern));
            
            if (args.rc == complement) {
                StringBuffer rc;
                for (int i = L-1; i>=0; i--) {
                    rc.appendChar (complement_chars[pattern.getChar (i)]);
                }
                patterns[L]->appendValue(patternToCode (rc));
            }
            
            pattern.resetString ();
        } else {
            throw (std::string ("Motif '") + std::string (pattern.getString()) + "' is not 4-16 nucleotides in length");
        }
    };
    
    try {
        // parse the patterns
        StringBuffer pattern;
        char automatonState = 0;
        long firstSequenceLength = strlen (args.motif_list);
 
        for (unsigned i = 0; i < firstSequenceLength; i++) {
            char current_char = toupper (args.motif_list[i]);
            if (allowed_chars [current_char] >= 0) {
                automatonState = 1;
                pattern.appendChar (current_char);
            } else {
                if (automatonState == 1) {
                    process_motif (pattern);
                }
                automatonState = 0;
            }
        }
        
        if (automatonState == 1) {
            process_motif (pattern);
        }

        return 1;
        automatonState = 0;
        while (long state = readFASTA(args.input, automatonState, names, sequences, nameLengths,
                                      seqLengths, firstSequenceLength, true)) { // read sequences one by one
            
            firstSequenceLength = 0L;
        }

    } catch (const std::string err) {
        cerr << "ERROR: " << err << endl;
        return 1;
    }
    
    return 0;
}